

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_simd_three_reg_same_extra(DisasContext_conflict1 *s,uint32_t insn)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint rd;
  long lVar4;
  _Bool _Var5;
  int line;
  uint rm;
  _Bool is_fp16;
  uint uVar6;
  code *pcVar7;
  uint uVar8;
  
  uVar8 = insn >> 0xb & 0xf;
  uVar2 = (insn & 0x20000000) >> 0x19;
  if (0x1e < (uVar2 | uVar8)) goto switchD_006a8bf6_caseD_0;
  uVar6 = insn >> 0x16 & 3;
  if ((0x5f000000U >> (uVar2 | uVar8) & 1) == 0) {
    if ((0x30000U >> (uVar2 | uVar8) & 1) == 0) {
      if (((0x40004U >> (uVar2 | uVar8) & 1) == 0) || (uVar6 != 2)) goto switchD_006a8bf6_caseD_0;
      uVar3 = 0xf00000000000;
    }
    else {
      if (uVar6 - 3 < 0xfffffffe) goto switchD_006a8bf6_caseD_0;
      uVar3 = 0xf0000000;
    }
    lVar4 = 0x48;
  }
  else {
    uVar3 = 0xf0000;
    lVar4 = 0x50;
    switch(uVar6) {
    case 0:
      goto switchD_006a8bf6_caseD_0;
    case 1:
      if ((uVar6 == 3 && (insn & 0x40000000) == 0) ||
         (((uint)s->isar->id_aa64pfr0 & 0xf0000) != 0x10000)) goto switchD_006a8bf6_caseD_0;
      break;
    case 3:
      if ((insn >> 0x1e & 1) == 0) goto switchD_006a8bf6_caseD_0;
    }
  }
  if ((*(ulong *)((long)&s->isar->id_isar0 + lVar4) & uVar3) == 0) {
switchD_006a8bf6_caseD_0:
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  if (0xe < uVar8) {
switchD_006a8ce1_caseD_3:
    line = 0x2f60;
LAB_006a8e7d:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,line,(char *)0x0);
  }
  rd = insn & 0x1f;
  uVar2 = insn >> 5 & 0x1f;
  rm = insn >> 0x10 & 0x1f;
  bVar1 = (byte)(insn >> 0x18);
  switch(uVar8) {
  case 0:
    if (uVar6 == 2) {
      _Var5 = (_Bool)(bVar1 >> 6 & 1);
      pcVar7 = gen_helper_gvec_qrdmlah_s32;
    }
    else {
      if (uVar6 != 1) {
        line = 0x2f1d;
        goto LAB_006a8e7d;
      }
      _Var5 = (_Bool)(bVar1 >> 6 & 1);
      pcVar7 = gen_helper_gvec_qrdmlah_s16;
    }
    goto LAB_006a8e14;
  case 1:
    if (uVar6 == 2) {
      _Var5 = (_Bool)(bVar1 >> 6 & 1);
      pcVar7 = gen_helper_gvec_qrdmlsh_s32;
    }
    else {
      if (uVar6 != 1) {
        line = 0x2f2a;
        goto LAB_006a8e7d;
      }
      _Var5 = (_Bool)(bVar1 >> 6 & 1);
      pcVar7 = gen_helper_gvec_qrdmlsh_s16;
    }
LAB_006a8e14:
    gen_gvec_op3_env(s,_Var5,rd,uVar2,rm,pcVar7);
    return;
  case 2:
    pcVar7 = gen_helper_gvec_udot_b;
    if ((insn & 0x20000000) == 0) {
      pcVar7 = gen_helper_gvec_sdot_b;
    }
    gen_gvec_op3_ool(s,(_Bool)(bVar1 >> 6 & 1),rd,uVar2,rm,0,pcVar7);
    return;
  default:
    goto switchD_006a8ce1_caseD_3;
  case 8:
  case 9:
  case 10:
  case 0xb:
    uVar8 = insn >> 0xb & 3;
    switch(uVar6) {
    case 0:
      line = 0x2f46;
      goto LAB_006a8e7d;
    case 1:
      pcVar7 = gen_helper_gvec_fcmlah;
LAB_006a8d33:
      _Var5 = (_Bool)(bVar1 >> 6 & 1);
      is_fp16 = true;
      goto LAB_006a8dea;
    case 2:
      _Var5 = (_Bool)(bVar1 >> 6 & 1);
      pcVar7 = gen_helper_gvec_fcmlas;
      break;
    case 3:
      _Var5 = (_Bool)(bVar1 >> 6 & 1);
      pcVar7 = gen_helper_gvec_fcmlad;
    }
    break;
  case 0xc:
  case 0xe:
    uVar8 = insn >> 0xc & 1;
    switch(uVar6) {
    case 0:
      line = 0x2f5b;
      goto LAB_006a8e7d;
    case 1:
      pcVar7 = gen_helper_gvec_fcaddh;
      goto LAB_006a8d33;
    case 2:
      _Var5 = (_Bool)(bVar1 >> 6 & 1);
      pcVar7 = gen_helper_gvec_fcadds;
      break;
    case 3:
      _Var5 = (_Bool)(bVar1 >> 6 & 1);
      pcVar7 = gen_helper_gvec_fcaddd;
    }
  }
  is_fp16 = false;
LAB_006a8dea:
  gen_gvec_op3_fpst(s,_Var5,rd,uVar2,rm,is_fp16,uVar8,pcVar7);
  return;
}

Assistant:

static void disas_simd_three_reg_same_extra(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 4);
    int rm = extract32(insn, 16, 5);
    int size = extract32(insn, 22, 2);
    bool u = extract32(insn, 29, 1);
    bool is_q = extract32(insn, 30, 1);
    bool feature;
    int rot;

    switch (u * 16 + opcode) {
    case 0x10: /* SQRDMLAH (vector) */
    case 0x11: /* SQRDMLSH (vector) */
        if (size != 1 && size != 2) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_rdm, s);
        break;
    case 0x02: /* SDOT (vector) */
    case 0x12: /* UDOT (vector) */
        if (size != MO_32) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_dp, s);
        break;
    case 0x18: /* FCMLA, #0 */
    case 0x19: /* FCMLA, #90 */
    case 0x1a: /* FCMLA, #180 */
    case 0x1b: /* FCMLA, #270 */
    case 0x1c: /* FCADD, #90 */
    case 0x1e: /* FCADD, #270 */
        if (size == 0
            || (size == 1 && !dc_isar_feature(aa64_fp16, s))
            || (size == 3 && !is_q)) {
            unallocated_encoding(s);
            return;
        }
        feature = dc_isar_feature(aa64_fcma, s);
        break;
    default:
        unallocated_encoding(s);
        return;
    }
    if (!feature) {
        unallocated_encoding(s);
        return;
    }
    if (!fp_access_check(s)) {
        return;
    }

    switch (opcode) {
    case 0x0: /* SQRDMLAH (vector) */
        switch (size) {
        case 1:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlah_s16);
            break;
        case 2:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlah_s32);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    case 0x1: /* SQRDMLSH (vector) */
        switch (size) {
        case 1:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlsh_s16);
            break;
        case 2:
            gen_gvec_op3_env(s, is_q, rd, rn, rm, gen_helper_gvec_qrdmlsh_s32);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    case 0x2: /* SDOT / UDOT */
        gen_gvec_op3_ool(s, is_q, rd, rn, rm, 0,
                         u ? gen_helper_gvec_udot_b : gen_helper_gvec_sdot_b);
        return;

    case 0x8: /* FCMLA, #0 */
    case 0x9: /* FCMLA, #90 */
    case 0xa: /* FCMLA, #180 */
    case 0xb: /* FCMLA, #270 */
        rot = extract32(opcode, 0, 2);
        switch (size) {
        case 1:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, true, rot,
                              gen_helper_gvec_fcmlah);
            break;
        case 2:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, false, rot,
                              gen_helper_gvec_fcmlas);
            break;
        case 3:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, false, rot,
                              gen_helper_gvec_fcmlad);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    case 0xc: /* FCADD, #90 */
    case 0xe: /* FCADD, #270 */
        rot = extract32(opcode, 1, 1);
        switch (size) {
        case 1:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, size == 1, rot,
                              gen_helper_gvec_fcaddh);
            break;
        case 2:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, size == 1, rot,
                              gen_helper_gvec_fcadds);
            break;
        case 3:
            gen_gvec_op3_fpst(s, is_q, rd, rn, rm, size == 1, rot,
                              gen_helper_gvec_fcaddd);
            break;
        default:
            g_assert_not_reached();
        }
        return;

    default:
        g_assert_not_reached();
    }
}